

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyCheckUrl(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  tmbstr ptVar6;
  int iVar7;
  undefined4 uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ctmbstr ptVar12;
  TidyDocImpl *pTVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_54;
  uint c;
  TidyDocImpl *local_48;
  Node *local_40;
  AttVal *local_38;
  
  if ((attval == (AttVal *)0x0) || (ptVar12 = attval->value, ptVar12 == (ctmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x254);
    return;
  }
  iVar3 = prvTidytmbstrncmp(ptVar12,"javascript:",0xb);
  iVar10 = 0;
  iVar14 = 0;
  uVar4 = 0;
  do {
    bVar1 = ptVar12[uVar4];
    if (bVar1 == 0x5c) {
      iVar14 = iVar14 + 1;
      if (*(int *)((doc->config).value + 0x1b) != 0 && iVar3 != 0) {
        ptVar12[uVar4] = '/';
      }
    }
    else {
      if (bVar1 == 0) break;
      if (((byte)(bVar1 + 0x81) < 0xa2) || ((bVar1 | 2) == 0x3e)) {
        iVar10 = iVar10 + 1;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
  local_54 = 0;
  local_48 = doc;
  for (; pTVar13 = local_48, *ptVar12 != '\0'; ptVar12 = ptVar12 + (uVar5 + 1)) {
    uVar5 = prvTidyGetUTF8(ptVar12,&c);
    uVar4 = (c & 0xffffffdf) - 0x41;
    if ((((0x19 < uVar4) &&
         (auVar17._0_4_ = -(uint)(c == 0x25), auVar17._4_4_ = -(uint)(c == 0x40),
         auVar17._8_4_ = -(uint)(c == 0x5f), auVar17._12_4_ = -(uint)(c == 0x7e),
         iVar7 = movmskps(uVar4,auVar17), iVar7 == 0)) &&
        (uVar4 = (c & 0xfff8fffe) - 0x80000, 0xfffd < uVar4)) &&
       (auVar19._0_4_ = -(uint)((c & 0xfffffffd) == 0x21),
       auVar19._4_4_ = -(uint)((c & 0xfffffffd) == 0x24),
       auVar19._8_4_ = -(uint)((c & 0xfffffffe) == 0x3a),
       auVar19._12_4_ = -(uint)((c & 0xfffffffd) == 0x3d), uVar8 = movmskps(uVar4,auVar19),
       (char)uVar8 == '\0')) {
      auVar16._0_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x30 ^ 0x80000000));
      auVar16._4_4_ = -(uint)(-0x7ffffff8 < (int)(c - 0x27 ^ 0x80000000));
      auVar16._8_4_ = -(uint)(-0x7fff28a1 < (int)(c - 0xa0 ^ 0x80000000));
      auVar16._12_4_ = -(uint)(-0x7fffe231 < (int)(c - 0xe000 ^ 0x80000000));
      auVar18._0_4_ = -(uint)(-0x7ffffe01 < (int)(c - 0xfdf0 ^ 0x80000000));
      auVar18._4_4_ = -(uint)(-0x7fff0003 < (int)(c - 0x10000 ^ 0x80000000));
      auVar18._8_4_ = -(uint)(-0x7fff0003 < (int)((c & 0xfffefffe) - 0x20000 ^ 0x80000000));
      auVar18._12_4_ = -(uint)(-0x7fff0003 < (int)((c & 0xfffcfffe) - 0x40000 ^ 0x80000000));
      auVar17 = packssdw(auVar16,auVar18);
      auVar17 = packsswb(auVar17,auVar17);
      if ((byte)(SUB161(auVar17 >> 7,0) & 1 | (SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar17 >> 0x17,0) & 1) << 2 | (SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar17 >> 0x27,0) & 1) << 4 | (SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar17 >> 0x37,0) & 1) << 6 | SUB161(auVar17 >> 0x3f,0) << 7) == 0xff) {
        local_54 = local_54 + (uint)(c - 0x10fffe < 0xffff0002);
      }
    }
  }
  if (iVar10 != 0 && *(int *)((local_48->config).value + 0x1d) != 0) {
    ptVar12 = attval->value;
    local_40 = node;
    local_38 = attval;
    uVar5 = prvTidytmbstrlen(ptVar12);
    ptVar6 = (tmbstr)(*pTVar13->allocator->vtbl->alloc)
                               (pTVar13->allocator,(long)uVar5 + (long)iVar10 * 2 + 1);
    uVar11 = 0;
    uVar15 = 0;
    bVar2 = false;
    while( true ) {
      attval = local_38;
      pTVar13 = local_48;
      bVar1 = ptVar12[uVar11];
      uVar9 = (ulong)bVar1;
      if (bVar1 == 0) break;
      if ((byte)(bVar1 + 0x81) < 0xa2) {
        if (bVar1 != 0x20) {
LAB_00139f0d:
          iVar7 = sprintf(ptVar6 + uVar15,"%%%02X",uVar9);
          uVar4 = (int)uVar15 + iVar7;
          goto LAB_00139f17;
        }
        if (bVar2) {
          uVar9 = 0x20;
          goto LAB_00139f0d;
        }
        bVar2 = false;
      }
      else {
        if ((bVar1 | 2) == 0x3e) goto LAB_00139f0d;
        uVar4 = (int)uVar15 + 1;
        ptVar6[uVar15] = bVar1;
LAB_00139f17:
        uVar15 = (ulong)uVar4;
        bVar2 = true;
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    ptVar6[uVar15] = '\0';
    (*local_48->allocator->vtbl->free)(local_48->allocator,local_38->value);
    attval->value = ptVar6;
    node = local_40;
  }
  if (iVar14 != 0) {
    uVar5 = 0x23e;
    if (iVar3 == 0) {
      uVar5 = 0x227;
    }
    if (*(int *)((pTVar13->config).value + 0x1b) == 0) {
      uVar5 = 0x227;
    }
    prvTidyReportAttrError(pTVar13,node,attval,uVar5);
  }
  if (iVar10 == 0) goto LAB_00139fc4;
  uVar5 = 0x23a;
  if (*(int *)((pTVar13->config).value + 0x1d) == 0) {
    uVar4 = prvTidyHTMLVersion(pTVar13);
    if ((uVar4 & 0x60000) == 0) {
      uVar5 = 0x243;
      goto LAB_00139f9d;
    }
  }
  else {
LAB_00139f9d:
    prvTidyReportAttrError(pTVar13,node,attval,uVar5);
  }
  *(byte *)&pTVar13->badChars = (byte)pTVar13->badChars | 0x20;
LAB_00139fc4:
  if (local_54 != 0) {
    prvTidyReportAttrError(pTVar13,node,attval,0x242);
  }
  return;
}

Assistant:

void TY_(CheckUrl)( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbchar c;
    tmbstr dest, p;
    uint escape_count = 0, backslash_count = 0, bad_codepoint_count = 0;
    uint i, pos = 0;
    uint len;
    uint increment;
    Bool isJavascript = no;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    p = attval->value;

    isJavascript =
        TY_(tmbstrncmp)(p,"javascript:",sizeof("javascript:")-1)==0;

    for (i = 0; '\0' != (c = p[i]); ++i)
    {
        if (c == '\\')
        {
            ++backslash_count;
            if ( cfgBool(doc, TidyFixBackslash) && !isJavascript)
                p[i] = '/';
        }
        else if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            ++escape_count;
    }

    while ( *p != 0 )
    {
        if ( !IsURLCodePoint( p, &increment ) )
            ++bad_codepoint_count;
         p = p + increment;
    }
    p = attval->value;

    if ( cfgBool(doc, TidyFixUri) && escape_count )
    {
        Bool hadnonspace = no;
        len = TY_(tmbstrlen)(p) + escape_count * 2 + 1;
        dest = (tmbstr) TidyDocAlloc(doc, len);
 
        for (i = 0; 0 != (c = p[i]); ++i)
        {
            if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            {
                if (c == 0x20)
                {
                    /* #345 - special case for leading spaces - discard */
                    if (hadnonspace)
                        pos += sprintf( dest + pos, "%%%02X", (byte)c );
                }
                else
                {
                    pos += sprintf( dest + pos, "%%%02X", (byte)c );
                    hadnonspace = yes;
                }
            }
            else
            {
                hadnonspace = yes;
                dest[pos++] = c;
            }
        }
        dest[pos] = 0;

        TidyDocFree(doc, attval->value);
        attval->value = dest;
    }
    if ( backslash_count )
    {
        if ( cfgBool(doc, TidyFixBackslash) && !isJavascript )
            TY_(ReportAttrError)( doc, node, attval, FIXED_BACKSLASH );
        else
            TY_(ReportAttrError)( doc, node, attval, BACKSLASH_IN_URI );
    }
    if ( escape_count )
    {
        if ( cfgBool(doc, TidyFixUri) )
            TY_(ReportAttrError)( doc, node, attval, ESCAPED_ILLEGAL_URI);
        else if ( !(TY_(HTMLVersion)(doc) & VERS_HTML5) )
            TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_REFERENCE);

        doc->badChars |= BC_INVALID_URI;
    }
    if ( bad_codepoint_count )
    {
        TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_CODEPOINT );
    }
}